

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
UntypedPerformAction
          (FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<BasicTestExpr<1>_> *pAVar1;
  Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *in_RDX;
  ArgumentTuple *args;
  Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> action;
  Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> local_28;
  Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *local_18;
  
  local_18 = in_RDX;
  Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::Action
            (&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<BasicTestExpr<1>>::
           PerformAction<BasicTestExpr<1>(TestExprBuilder<2,BasicTestExpr<1>>)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::~Action
            ((Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *)0x1d8f71);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }